

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.hpp
# Opt level: O0

void __thiscall
de::cmdline::Option<tcu::opt::EGLDisplayType>::Option
          (Option<tcu::opt::EGLDisplayType> *this,char *shortName_,char *longName_,
          char *description_,char *defaultValue_)

{
  char *defaultValue__local;
  char *description__local;
  char *longName__local;
  char *shortName__local;
  Option<tcu::opt::EGLDisplayType> *this_local;
  
  this->shortName = shortName_;
  this->longName = longName_;
  this->description = description_;
  this->defaultValue = defaultValue_;
  this->parse = parseType<std::__cxx11::string>;
  this->namedValues =
       (NamedValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  this->namedValuesEnd =
       (NamedValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  return;
}

Assistant:

Option (const char* shortName_, const char* longName_, const char* description_, const char* defaultValue_ = DE_NULL)
		: shortName		(shortName_)
		, longName		(longName_)
		, description	(description_)
		, defaultValue	(defaultValue_)
		, parse			(parseType<ValueType>)
		, namedValues	(DE_NULL)
		, namedValuesEnd(0)
	{
	}